

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  long lVar1;
  TestStatus *pTVar2;
  DeviceInterface *vk;
  VkDevice device;
  const_iterator cVar3;
  Unique<vk::Handle<(vk::HandleType)14>_> obj2;
  Unique<vk::Handle<(vk::HandleType)14>_> obj3;
  Unique<vk::Handle<(vk::HandleType)14>_> obj1;
  Unique<vk::Handle<(vk::HandleType)14>_> obj0;
  VkShaderModuleCreateInfo local_110;
  Move<vk::Handle<(vk::HandleType)14>_> local_e8;
  TestStatus *local_c0;
  Move<vk::Handle<(vk::HandleType)14>_> local_b8;
  Move<vk::Handle<(vk::HandleType)14>_> local_98;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  Move<vk::Handle<(vk::HandleType)14>_> local_50;
  
  local_c0 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection,&params->binaryName);
  lVar1 = *(long *)(cVar3._M_node + 2);
  local_110.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.codeSize = *(long *)(lVar1 + 0x10) - (long)*(deUint32 **)(lVar1 + 8);
  local_110.pCode = *(deUint32 **)(lVar1 + 8);
  if (local_110.codeSize == 0) {
    local_110.pCode = (deUint32 *)0x0;
  }
  ::vk::createShaderModule(&local_98,vk,device,&local_110,(VkAllocationCallbacks *)0x0);
  local_78.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  DStack_70.m_deviceIface =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  DStack_70.m_device =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  DStack_70.m_allocator =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_110.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.codeSize = *(long *)(lVar1 + 0x10) - (long)*(deUint32 **)(lVar1 + 8);
  local_110.pCode = *(deUint32 **)(lVar1 + 8);
  if (local_110.codeSize == 0) {
    local_110.pCode = (deUint32 *)0x0;
  }
  ::vk::createShaderModule(&local_e8,vk,device,&local_110,(VkAllocationCallbacks *)0x0);
  local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_110.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.codeSize = *(long *)(lVar1 + 0x10) - (long)*(deUint32 **)(lVar1 + 8);
  local_110.pCode = *(deUint32 **)(lVar1 + 8);
  if (local_110.codeSize == 0) {
    local_110.pCode = (deUint32 *)0x0;
  }
  ::vk::createShaderModule(&local_b8,vk,device,&local_110,(VkAllocationCallbacks *)0x0);
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  local_110.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.codeSize = *(long *)(lVar1 + 0x10) - (long)*(deUint32 **)(lVar1 + 8);
  local_110.pCode = *(deUint32 **)(lVar1 + 8);
  if (local_110.codeSize == 0) {
    local_110.pCode = (deUint32 *)0x0;
  }
  ::vk::createShaderModule(&local_50,vk,device,&local_110,(VkAllocationCallbacks *)0x0);
  pTVar2 = local_c0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  if (local_50.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkShaderModule)
               local_50.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  if (local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkShaderModule)
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  if (local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkShaderModule)
               local_98.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  local_110._0_8_ = (void *)((long)&local_110 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Ok","");
  pTVar2->m_code = QP_TEST_RESULT_PASS;
  (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar2->m_description,local_110._0_8_,
             (long)local_110.pNext + local_110._0_8_);
  if ((void *)local_110._0_8_ != (void *)((long)&local_110 + 0x10U)) {
    operator_delete((void *)local_110._0_8_,CONCAT44(local_110._20_4_,local_110.flags) + 1);
  }
  return pTVar2;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}